

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  urlq_handle_t p_Var1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  urlq_getopt_t *opts_00;
  urlq_getopt_t opts;
  char url [8192];
  
  coda_url::coda_url(&opts.parent);
  opts.parent.dom_len = 0;
  opts.parent._28_4_ = 0;
  opts.handle = (urlq_handle_t)0x0;
  opts.parent.val_len = 0;
  opts.parent._12_4_ = 0;
  opts.parent.dom_str = (char *)0x0;
  opts._0_8_ = 0;
  opts.parent.val_str = (char *)0x0;
  iVar3 = argc;
  iVar2 = urlq_getopt_parse(argc,argv,&opts);
  if (iVar2 == 0) {
    opts_00 = &opts;
    iVar2 = urlq_load(opts_00);
    iVar3 = (int)opts_00;
    if (iVar2 == 0) {
      for (lVar6 = (long)_optind; p_Var1 = opts.handle, lVar6 < argc; lVar6 = lVar6 + 1) {
        pcVar5 = argv[lVar6];
        sVar4 = strlen(pcVar5);
        (*p_Var1)(pcVar5,sVar4,&opts);
      }
      if (argc <= _optind) {
        while( true ) {
          iVar3 = feof(_stdin);
          __stream = _stdin;
          if (iVar3 != 0) break;
          iVar3 = ferror(_stdin);
          if (iVar3 != 0) break;
          pcVar5 = fgets(url,0x2000,__stream);
          if (pcVar5 == (char *)0x0) break;
          sVar4 = strcspn(url,"\r\n");
          url[sVar4] = '\0';
          (*opts.handle)(url,sVar4,&opts);
        }
      }
      coda_url::~coda_url(&opts.parent);
      return 0;
    }
  }
  urlq_getopt_usage(iVar3,argv);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    int i;

    urlq_getopt_t opts;
    std::memset(static_cast<void*>(&opts), 0, sizeof(opts));

    if (0 != urlq_getopt_parse(argc, argv, &opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    if (0 != urlq_load(&opts))
    {
        urlq_getopt_usage(argc, argv);
        exit(EXIT_FAILURE);
    }

    for (i = optind; i < argc; ++i)
    {
        opts.handle(argv[i], strlen(argv[i]), &opts);
    }

    if (optind < argc)
    {
        return 0;
    }

    while (!feof(stdin) && !ferror(stdin))
    {
        char url [URLBUF];
        size_t sz;

        if (NULL == fgets(url, URLBUF, stdin))
        {
            break;
        }

        sz = strcspn(url, "\r\n");  /* optional */
        url[sz] = 0;                /* optional */

        opts.handle(url, sz, &opts);
    }

    return 0;
}